

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test::TestBody
          (Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_180 [8];
  Message local_178 [8];
  double local_170;
  double local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_4;
  Message local_148 [8];
  double local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120 [8];
  double local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  double newSamplingRate;
  double newLowerBound;
  Message local_e8 [8];
  double local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0 [8];
  Message local_b8 [24];
  double local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  GuaranteedThroughputProbabilisticSampler sampler;
  double samplingRate;
  double lowerBound;
  Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test *this_local;
  
  samplingRate = 2.0;
  sampler._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3fe0000000000000;
  lowerBound = (double)this;
  GuaranteedThroughputProbabilisticSampler::GuaranteedThroughputProbabilisticSampler
            ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_,2.0,0.5);
  local_a0 = GuaranteedThroughputProbabilisticSampler::lowerBound
                       ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_98,"lowerBound","sampler.lowerBound()",&samplingRate,&local_a0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::Message::~Message(local_b8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_e0 = GuaranteedThroughputProbabilisticSampler::samplingRate
                         ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_d8,"samplingRate","sampler.samplingRate()",
               (double *)
               &sampler._tags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&newLowerBound,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xcc,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&newLowerBound,local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newLowerBound);
      testing::Message::~Message(local_e8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      newSamplingRate = 1.0;
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe3333333333333;
      jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update(1.0,0.6);
      local_118 = GuaranteedThroughputProbabilisticSampler::lowerBound
                            ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_);
      testing::internal::EqHelper<false>::Compare<double,double>
                ((EqHelper<false> *)local_110,"newLowerBound","sampler.lowerBound()",
                 &newSamplingRate,&local_118);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
      if (!bVar1) {
        testing::Message::Message(local_120);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0xd1,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_120);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_140 = GuaranteedThroughputProbabilisticSampler::samplingRate
                              ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_);
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((EqHelper<false> *)local_138,"newSamplingRate","sampler.samplingRate()",
                   (double *)&gtest_ar_2.message_,&local_140);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(local_148);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0xd2,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_148)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(local_148);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_2.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x3ff199999999999a;
          jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update
                    (newSamplingRate,1.1);
          local_168 = 1.0;
          local_170 = GuaranteedThroughputProbabilisticSampler::samplingRate
                                ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_);
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((EqHelper<false> *)local_160,"1.0","sampler.samplingRate()",&local_168,
                     &local_170);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(local_178);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
            testing::internal::AssertHelper::AssertHelper
                      (local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0xd6,pcVar2);
            testing::internal::AssertHelper::operator=(local_180,local_178);
            testing::internal::AssertHelper::~AssertHelper(local_180);
            testing::Message::~Message(local_178);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            gtest_ar_1.message_.ptr_._4_4_ = 0;
          }
        }
      }
    }
  }
  GuaranteedThroughputProbabilisticSampler::~GuaranteedThroughputProbabilisticSampler
            ((GuaranteedThroughputProbabilisticSampler *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Sampler, testGuaranteedThroughputProbabilisticSamplerUpdate)
{
    auto lowerBound = 2.0;
    auto samplingRate = 0.5;
    GuaranteedThroughputProbabilisticSampler sampler(lowerBound, samplingRate);
    ASSERT_EQ(lowerBound, sampler.lowerBound());
    ASSERT_EQ(samplingRate, sampler.samplingRate());

    auto newLowerBound = 1.0;
    auto newSamplingRate = 0.6;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(newLowerBound, sampler.lowerBound());
    ASSERT_EQ(newSamplingRate, sampler.samplingRate());

    newSamplingRate = 1.1;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(1.0, sampler.samplingRate());
}